

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket.c
# Opt level: O0

void msocket_set_handler(msocket_t *self,msocket_handler_t *handlerTable,void *handlerArg)

{
  msocket_handler_t *pmVar1;
  void *handlerArg_local;
  msocket_handler_t *handlerTable_local;
  msocket_t *self_local;
  
  if (self != (msocket_t *)0x0) {
    if (self->handlerTable != (msocket_handler_t *)0x0) {
      free(self->handlerTable);
    }
    pmVar1 = (msocket_handler_t *)malloc(0x30);
    self->handlerTable = pmVar1;
    if (self->handlerTable != (msocket_handler_t *)0x0) {
      memcpy(self->handlerTable,handlerTable,0x30);
      self->handlerArg = handlerArg;
    }
  }
  return;
}

Assistant:

void msocket_set_handler(msocket_t *self, const msocket_handler_t *handlerTable, void *handlerArg){
   if(self != 0){
      if(self->handlerTable != 0){
         free(self->handlerTable);
      }
      self->handlerTable = (msocket_handler_t*) malloc(sizeof(msocket_handler_t));
      if(self->handlerTable != 0){
        memcpy(self->handlerTable,handlerTable,sizeof(msocket_handler_t));
        self->handlerArg = handlerArg;
      }
   }
}